

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_finished(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *ppVar2;
  size_t sVar3;
  uint8_t *puVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  ptls_hash_context_t **pppVar9;
  size_t sVar10;
  
  iVar7 = (*emitter->begin_message)(emitter);
  if (iVar7 == 0) {
    buf = emitter->buf;
    ppVar2 = tls->key_schedule;
    sVar3 = buf->off;
    iVar7 = ptls_buffer_reserve(buf,1);
    if (iVar7 == 0) {
      buf->base[buf->off] = '\x14';
      buf->off = buf->off + 1;
      iVar7 = ptls_buffer_reserve(buf,3);
      if (iVar7 == 0) {
        puVar4 = buf->base;
        sVar5 = buf->off;
        puVar4[sVar5 + 2] = '\0';
        puVar4 = puVar4 + sVar5;
        puVar4[0] = '\0';
        puVar4[1] = '\0';
        sVar10 = buf->off;
        sVar5 = sVar10 + 3;
        buf->off = sVar5;
        iVar7 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if (iVar7 == 0) {
          iVar7 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                   &(tls->traffic_protection).enc);
          if (iVar7 == 0) {
            psVar1 = &emitter->buf->off;
            *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
            sVar6 = buf->off;
            lVar8 = 0x10;
            do {
              buf->base[sVar10] = (uint8_t)(sVar6 - sVar5 >> ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + -8;
              sVar10 = sVar10 + 1;
            } while (lVar8 != -8);
            if ((ppVar2 != (ptls_key_schedule_t *)0x0) && (ppVar2->num_hashes != 0)) {
              puVar4 = buf->base;
              sVar5 = buf->off;
              pppVar9 = &ppVar2->hashes[0].ctx;
              sVar10 = 0;
              do {
                (*(*pppVar9)->update)(*pppVar9,puVar4 + sVar3,sVar5 - sVar3);
                sVar10 = sVar10 + 1;
                pppVar9 = pppVar9 + 2;
              } while (sVar10 != ppVar2->num_hashes);
            }
            iVar7 = (*emitter->commit_message)(emitter);
            return iVar7;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    int ret;

    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
        if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
            goto Exit;
        if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                    tls->traffic_protection.enc.secret)) != 0)
            goto Exit;
        emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
    });

Exit:
    return ret;
}